

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eh-utils.cpp
# Opt level: O0

void wasm::EHUtils::handleBlockNestedPop(Try *try_,Function *func,Module *wasm)

{
  Expression *right;
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  Name *pNVar4;
  Expression **ppEVar5;
  LocalSet *left;
  Block *pBVar6;
  LocalGet *pLVar7;
  optional<wasm::Type> type;
  optional<wasm::Type> local_a8;
  uintptr_t local_98;
  Index local_8c;
  Expression *pEStack_88;
  Index newLocal;
  Expression *pop;
  Expression **popPtr;
  Expression *pEStack_70;
  bool isPopNested;
  Expression *catchBody;
  Type local_60;
  Tag *local_58;
  char *local_50;
  Tag *local_48;
  Tag *tag;
  Name tagName;
  Index i;
  Builder builder;
  Module *wasm_local;
  Function *func_local;
  Try *try__local;
  
  builder.wasm = wasm;
  Builder::Builder((Builder *)&stack0xffffffffffffffd8,wasm);
  tagName.super_IString.str._M_str._4_4_ = 0;
  do {
    uVar2 = (ulong)tagName.super_IString.str._M_str._4_4_;
    sVar3 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                      (&(try_->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>
                      );
    if (sVar3 <= uVar2) {
      return;
    }
    pNVar4 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       (&(try_->catchTags).
                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                        (ulong)tagName.super_IString.str._M_str._4_4_);
    local_58 = (Tag *)(pNVar4->super_IString).str._M_len;
    local_50 = (pNVar4->super_IString).str._M_str;
    tag = local_58;
    tagName.super_IString.str._M_len = (size_t)local_50;
    local_48 = Module::getTag(builder.wasm,(Name)(pNVar4->super_IString).str);
    local_60 = wasm::Tag::params(local_48);
    catchBody._4_4_ = 0;
    bVar1 = wasm::Type::operator==(&local_60,(BasicType *)((long)&catchBody + 4));
    if (!bVar1) {
      ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(try_->catchBodies).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)tagName.super_IString.str._M_str._4_4_);
      pEStack_70 = *ppEVar5;
      popPtr._7_1_ = 0;
      pop = (Expression *)0x0;
      pEStack_88 = getFirstPop(pEStack_70,(bool *)((long)&popPtr + 7),(Expression ***)&pop);
      if (pEStack_88 == (Expression *)0x0) {
        __assert_fail("pop && \"Pop has not been found in this catch\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/eh-utils.cpp"
                      ,0x7a,"void wasm::EHUtils::handleBlockNestedPop(Try *, Function *, Module &)")
        ;
      }
      if ((popPtr._7_1_ & 1) != 0) {
        if (pop == (Expression *)0x0) {
          __assert_fail("popPtr",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/eh-utils.cpp"
                        ,0x8e,
                        "void wasm::EHUtils::handleBlockNestedPop(Try *, Function *, Module &)");
        }
        local_98 = (pEStack_88->type).id;
        local_8c = Builder::addVar(func,(Type)local_98);
        left = Builder::makeLocalSet((Builder *)&stack0xffffffffffffffd8,local_8c,pEStack_88);
        right = pEStack_70;
        std::optional<wasm::Type>::optional(&local_a8);
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_7_ = 0;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             local_a8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_payload;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged =
             local_a8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_engaged;
        pBVar6 = Builder::makeSequence
                           ((Builder *)&stack0xffffffffffffffd8,(Expression *)left,right,type);
        ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(try_->catchBodies).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(ulong)tagName.super_IString.str._M_str._4_4_);
        *ppEVar5 = (Expression *)pBVar6;
        pLVar7 = Builder::makeLocalGet
                           ((Builder *)&stack0xffffffffffffffd8,local_8c,(Type)(pEStack_88->type).id
                           );
        *(LocalGet **)pop = pLVar7;
      }
    }
    tagName.super_IString.str._M_str._4_4_ = tagName.super_IString.str._M_str._4_4_ + 1;
  } while( true );
}

Assistant:

void handleBlockNestedPop(Try* try_, Function* func, Module& wasm) {
  Builder builder(wasm);
  for (Index i = 0; i < try_->catchTags.size(); i++) {
    Name tagName = try_->catchTags[i];
    auto* tag = wasm.getTag(tagName);
    if (tag->params() == Type::none) {
      continue;
    }

    auto* catchBody = try_->catchBodies[i];
    bool isPopNested = false;
    Expression** popPtr = nullptr;
    Expression* pop = getFirstPop(catchBody, isPopNested, popPtr);
    assert(pop && "Pop has not been found in this catch");

    // Change code like
    // (catch $e
    //   ...
    //   (block
    //     (pop i32)
    //   )
    // )
    // into
    // (catch $e
    //   (local.set $new
    //     (pop i32)
    //   )
    //   ...
    //   (block
    //     (local.get $new)
    //   )
    // )
    if (isPopNested) {
      assert(popPtr);
      Index newLocal = builder.addVar(func, pop->type);
      try_->catchBodies[i] =
        builder.makeSequence(builder.makeLocalSet(newLocal, pop), catchBody);
      *popPtr = builder.makeLocalGet(newLocal, pop->type);
    }
  }
}